

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O2

void matras_alloc_range_overflow_test(void)

{
  void *pvVar1;
  char *pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 local_90 [8];
  matras mat;
  matras_id_t id;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_alloc_range_overflow_test");
  plan(2);
  matras_create((matras *)local_90,0x10,&pta_allocator,(matras_stats *)0x0);
  uVar3 = 0xfffffffffffffffc;
  while( true ) {
    uVar3 = uVar3 + 4;
    pvVar1 = matras_alloc_range((matras *)local_90,(matras_id_t *)((long)&mat.stats + 4),4);
    if (0xff < uVar3) {
      _ok((uint)(pvVar1 == (void *)0x0),"matras_alloc_range(&mat, &id, range_count) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x172
          ,"line %d",0x172);
      _ok((uint)(mat.stats._4_4_ == 0xfc),"id == max_capacity - range_count",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x173
          ,"line %d",0x173);
      matras_destroy((matras *)local_90);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_alloc_range_overflow_test");
      check_plan();
      return;
    }
    if (pvVar1 == (void *)0x0) break;
    if (uVar3 != mat.stats._4_4_) {
      pcVar2 = "id == i";
      uVar4 = 0x16f;
LAB_001048be:
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar2,"false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              uVar4,"matras_alloc_range_overflow_test");
      exit(-1);
    }
  }
  pcVar2 = "data != NULL";
  uVar4 = 0x16e;
  goto LAB_001048be;
}

Assistant:

void
matras_alloc_range_overflow_test()
{
	header();
	plan(2);

	const size_t range_count = 4;
	size_t max_capacity = PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);

	matras_id_t id;
	struct matras mat;
	matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
	for (size_t i = 0; i < max_capacity; i += range_count) {
		void *data = matras_alloc_range(&mat, &id, range_count);
		fail_unless(data != NULL);
		fail_unless(id == i);
	}
	/* Try to exceed the maximum capacity. */
	ok(matras_alloc_range(&mat, &id, range_count) == NULL);
	ok(id == max_capacity - range_count);
	matras_destroy(&mat);

	footer();
	check_plan();
}